

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int sort_comp(lua_State *L,int a,int b)

{
  int iVar1;
  int res;
  int b_local;
  int a_local;
  lua_State *L_local;
  
  iVar1 = lua_type(L,2);
  if (iVar1 == 0) {
    L_local._4_4_ = lua_lessthan(L,a,b);
  }
  else {
    lua_pushvalue(L,2);
    lua_pushvalue(L,a + -1);
    lua_pushvalue(L,b + -2);
    lua_call(L,2,1);
    L_local._4_4_ = lua_toboolean(L,-1);
    lua_settop(L,-2);
  }
  return L_local._4_4_;
}

Assistant:

static int sort_comp(lua_State*L,int a,int b){
if(!lua_isnil(L,2)){
int res;
lua_pushvalue(L,2);
lua_pushvalue(L,a-1);
lua_pushvalue(L,b-2);
lua_call(L,2,1);
res=lua_toboolean(L,-1);
lua_pop(L,1);
return res;
}
else
return lua_lessthan(L,a,b);
}